

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_pcode.cpp
# Opt level: O0

void __thiscall PcodeGenerator::MergeSelfAssign(PcodeGenerator *this)

{
  __type _Var1;
  bool bVar2;
  PcodeType PVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  reference this_00;
  pointer this_01;
  const_iterator local_b0;
  Pcode *local_a8;
  __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_> local_a0;
  __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_> local_98;
  iterator iter;
  string local_88;
  undefined4 local_68;
  string local_58;
  undefined1 local_38 [8];
  string num1;
  int i;
  int count;
  PcodeGenerator *this_local;
  
  do {
    num1.field_2._12_4_ = 0;
    for (num1.field_2._8_4_ = 0; uVar4 = (ulong)(int)num1.field_2._8_4_,
        sVar5 = std::vector<Pcode,_std::allocator<Pcode>_>::size(&this->m_pcode_queue),
        uVar4 < sVar5 - 1; num1.field_2._8_4_ = num1.field_2._8_4_ + 1) {
      pvVar6 = std::vector<Pcode,_std::allocator<Pcode>_>::operator[]
                         (&this->m_pcode_queue,(long)(int)num1.field_2._8_4_);
      Pcode::GetNum1_abi_cxx11_((string *)local_38,pvVar6);
      pvVar6 = std::vector<Pcode,_std::allocator<Pcode>_>::operator[]
                         (&this->m_pcode_queue,(long)(num1.field_2._8_4_ + 1));
      Pcode::GetNum2_abi_cxx11_(&local_58,pvVar6);
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,&local_58);
      bVar2 = false;
      if (_Var1) {
        pvVar6 = std::vector<Pcode,_std::allocator<Pcode>_>::operator[]
                           (&this->m_pcode_queue,(long)(num1.field_2._8_4_ + 1));
        PVar3 = Pcode::GetOP(pvVar6);
        bVar2 = PVar3 == ASSIGN;
      }
      std::__cxx11::string::~string((string *)&local_58);
      if (bVar2) {
        bVar2 = GlobalJudge((string *)local_38);
        if ((!bVar2) && (bVar2 = FPJudge((string *)local_38), !bVar2)) {
          pvVar6 = std::vector<Pcode,_std::allocator<Pcode>_>::operator[]
                             (&this->m_pcode_queue,(long)(int)num1.field_2._8_4_);
          this_00 = std::vector<Pcode,_std::allocator<Pcode>_>::operator[]
                              (&this->m_pcode_queue,(long)(num1.field_2._8_4_ + 1));
          Pcode::GetNum1_abi_cxx11_(&local_88,this_00);
          Pcode::SetNum1(pvVar6,&local_88);
          std::__cxx11::string::~string((string *)&local_88);
          pvVar6 = std::vector<Pcode,_std::allocator<Pcode>_>::operator[]
                             (&this->m_pcode_queue,(long)(num1.field_2._8_4_ + 1));
          iter._M_current._4_4_ = 0x15;
          Pcode::SetOP(pvVar6,(PcodeType *)((long)&iter._M_current + 4));
          num1.field_2._8_4_ = num1.field_2._8_4_ + 1;
          num1.field_2._12_4_ = num1.field_2._12_4_ + 1;
          goto LAB_00197f8d;
        }
        local_68 = 6;
      }
      else {
LAB_00197f8d:
        local_68 = 0;
      }
      std::__cxx11::string::~string((string *)local_38);
    }
    local_98._M_current =
         (Pcode *)std::vector<Pcode,_std::allocator<Pcode>_>::begin(&this->m_pcode_queue);
    while( true ) {
      local_a0._M_current =
           (Pcode *)std::vector<Pcode,_std::allocator<Pcode>_>::end(&this->m_pcode_queue);
      bVar2 = __gnu_cxx::operator!=(&local_98,&local_a0);
      if (!bVar2) break;
      this_01 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
                operator->(&local_98);
      PVar3 = Pcode::GetOP(this_01);
      if (PVar3 == NOP) {
        __gnu_cxx::__normal_iterator<Pcode_const*,std::vector<Pcode,std::allocator<Pcode>>>::
        __normal_iterator<Pcode*>
                  ((__normal_iterator<Pcode_const*,std::vector<Pcode,std::allocator<Pcode>>> *)
                   &local_b0,&local_98);
        local_a8 = (Pcode *)std::vector<Pcode,_std::allocator<Pcode>_>::erase
                                      (&this->m_pcode_queue,local_b0);
        local_98._M_current = local_a8;
      }
      else {
        __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
        operator++(&local_98,0);
      }
    }
    if (num1.field_2._12_4_ == 0) {
      return;
    }
  } while( true );
}

Assistant:

void PcodeGenerator::MergeSelfAssign() {
    int count;
    do {
        count = 0;
        for (int i=0; i<m_pcode_queue.size()-1; ++i) {
            string num1 = m_pcode_queue[i].GetNum1();
            if (num1 == m_pcode_queue[i+1].GetNum2() && m_pcode_queue[i+1].GetOP() == ASSIGN) {
                if (GlobalJudge(num1) || FPJudge(num1))
                    continue;
                m_pcode_queue[i].SetNum1(m_pcode_queue[i+1].GetNum1());
                m_pcode_queue[i+1].SetOP(NOP);
                i++;
                count++;
            }
        }
        for (auto iter = m_pcode_queue.begin(); iter != m_pcode_queue.end();) {
            if (iter->GetOP() == NOP) {
                iter = m_pcode_queue.erase(iter);
            } else {
                iter++;
            }
        }
    } while (count != 0);
}